

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Acc(int g_a,int *lo,int *hi,void *buf,int *ld,void *alpha)

{
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int i_2;
  int i_1;
  int i;
  Integer _ga_work [7];
  Integer _ga_hi [7];
  Integer _ga_lo [7];
  Integer ndim;
  Integer a;
  undefined4 in_stack_fffffffffffffef8;
  int iVar1;
  int iVar2;
  int iVar3;
  void *in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  long local_b8 [8];
  long local_78 [7];
  long local_40;
  long local_38;
  long local_28;
  long local_18;
  long local_10;
  
  local_38 = (long)in_EDI;
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_40 = pnga_ndim((Integer)hi);
  for (iVar3 = 0; iVar3 < local_40; iVar3 = iVar3 + 1) {
    local_78[(local_40 - iVar3) + -1] = (long)*(int *)(local_10 + (long)iVar3 * 4) + 1;
  }
  for (iVar2 = 0; iVar2 < local_40; iVar2 = iVar2 + 1) {
    local_b8[(local_40 - iVar2) + -1] = (long)*(int *)(local_18 + (long)iVar2 * 4) + 1;
  }
  for (iVar1 = 0; (long)iVar1 < local_40 + -1; iVar1 = iVar1 + 1) {
    *(long *)(&stack0xffffffffffffff08 + ((local_40 - iVar1) + -2) * 8) =
         (long)*(int *)(local_28 + (long)iVar1 * 4);
  }
  pnga_acc(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
           in_stack_ffffffffffffff08,(Integer *)CONCAT44(iVar3,iVar2),
           (void *)CONCAT44(iVar1,in_stack_fffffffffffffef8));
  return;
}

Assistant:

void NGA_Acc(int g_a, int lo[], int hi[], void* buf,int ld[], void* alpha)
{
    Integer a=(Integer)g_a;
    Integer ndim = wnga_ndim(a);
    Integer _ga_lo[MAXDIM], _ga_hi[MAXDIM];
    Integer _ga_work[MAXDIM];
    COPYINDEX_C2F(lo,_ga_lo, ndim);
    COPYINDEX_C2F(hi,_ga_hi, ndim);
    COPYC2F(ld,_ga_work, ndim-1);
    wnga_acc(a, _ga_lo, _ga_hi, buf, _ga_work, alpha);
}